

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Response_NACK_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Minefield_Response_NACK_PDU::Minefield_Response_NACK_PDU
          (Minefield_Response_NACK_PDU *this,EntityIdentifier *MinefieldID,
          EntityIdentifier *RequestingSimulationID,KUINT8 ReqID,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *MissingSeqNums)

{
  KUINT16 KVar1;
  byte bVar2;
  
  Minefield_Header::Minefield_Header(&this->super_Minefield_Header);
  (this->super_Minefield_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Minefield_Response_NACK_PDU_00321de0;
  (this->m_ReqID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00311ab8;
  KVar1 = (RequestingSimulationID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_ReqID).super_SimulationIdentifier.m_ui16SiteID =
       (RequestingSimulationID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_ReqID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_ReqID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00311758;
  *(undefined2 *)&(this->m_ReqID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(RequestingSimulationID->super_SimulationIdentifier).field_0xc;
  this->m_ui8ReqID = ReqID;
  (this->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  KVar1 = (MinefieldID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->super_Minefield_Header).m_MinefieldID.super_SimulationIdentifier.m_ui16SiteID =
       (MinefieldID->super_SimulationIdentifier).m_ui16SiteID;
  (this->super_Minefield_Header).m_MinefieldID.super_SimulationIdentifier.m_ui16ApplicationID =
       KVar1;
  *(undefined2 *)&(this->super_Minefield_Header).m_MinefieldID.super_SimulationIdentifier.field_0xc
       = *(undefined2 *)&(MinefieldID->super_SimulationIdentifier).field_0xc;
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui8PDUType = '(';
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength = 0x1a;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->m_vSeqNums,MissingSeqNums);
  bVar2 = (char)(MissingSeqNums->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (char)(MissingSeqNums->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_start;
  this->m_ui8NumMisPdus = bVar2;
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength = bVar2 + 0x1a;
  return;
}

Assistant:

Minefield_Response_NACK_PDU::Minefield_Response_NACK_PDU( const EntityIdentifier & MinefieldID, const EntityIdentifier & RequestingSimulationID,
        KUINT8 ReqID, const vector<KUINT8> & MissingSeqNums ) :
    m_ReqID( RequestingSimulationID ),
    m_ui8ReqID( ReqID )
{
    m_MinefieldID = MinefieldID;
    m_ui8PDUType = MinefieldResponseNAK_PDU_Type;
    m_ui16PDULength = MINEFIELD_RESPONSE_NACK_SIZE;
    SetMissingPDUSequenceNumbers( MissingSeqNums );
}